

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

bool google::protobuf::io::Tokenizer::TryParseFloat(string *text,double *result)

{
  char *str;
  byte *in_RAX;
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  double dVar4;
  byte *local_28;
  
  str = (text->_M_dataplus)._M_p;
  local_28 = in_RAX;
  dVar4 = NoLocaleStrtod(str,(char **)&local_28);
  *result = dVar4;
  bVar2 = *local_28;
  pbVar1 = local_28;
  if ((bVar2 | 0x20) == 0x65) {
    bVar2 = local_28[1];
    if ((bVar2 == 0x2d) || (pbVar1 = local_28 + 1, bVar2 == 0x2b)) {
      bVar2 = local_28[2];
      pbVar1 = local_28 + 2;
    }
  }
  if ((bVar2 | 0x20) == 0x66) {
    pbVar1 = pbVar1 + 1;
  }
  if ((long)pbVar1 - (long)str == text->_M_string_length) {
    bVar3 = *str != '-';
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Tokenizer::TryParseFloat(const std::string& text, double* result) {
  const char* start = text.c_str();
  char* end;
  *result = NoLocaleStrtod(start, &end);

  // "1e" is not a valid float, but if the tokenizer reads it, it will
  // report an error but still return it as a valid token.  We need to
  // accept anything the tokenizer could possibly return, error or not.
  if (*end == 'e' || *end == 'E') {
    ++end;
    if (*end == '-' || *end == '+') ++end;
  }

  // If the Tokenizer had allow_f_after_float_ enabled, the float may be
  // suffixed with the letter 'f'.
  if (*end == 'f' || *end == 'F') {
    ++end;
  }

  return static_cast<size_t>(end - start) == text.size() && *start != '-';
}